

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

size_t __thiscall
capnp::expectedSizeInWordsFromPrefix(capnp *this,ArrayPtr<const_capnp::word> array)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (array.ptr != (word *)0x0) {
    uVar2 = (ulong)((*(int *)this + 1U >> 1) + 1);
    uVar3 = *(int *)this + 1;
    if (uVar3 != 0) {
      uVar4 = (long)array.ptr * 2 - 1;
      if (uVar4 < uVar3) {
        uVar3 = (uint)uVar4;
      }
      uVar4 = 1;
      if (1 < uVar3) {
        uVar4 = (ulong)uVar3;
      }
      uVar5 = 0;
      do {
        lVar1 = uVar5 * 4;
        uVar5 = uVar5 + 1;
        uVar2 = uVar2 + *(uint *)(this + lVar1 + 4);
      } while (uVar4 != uVar5);
    }
    return uVar2;
  }
  return 1;
}

Assistant:

size_t expectedSizeInWordsFromPrefix(kj::ArrayPtr<const word> array) {
  if (array.size() < 1) {
    // All messages are at least one word.
    return 1;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  // If the array is too small to contain the full segment table, truncate segmentCount to just
  // what is available.
  segmentCount = kj::min(segmentCount, array.size() * 2 - 1u);

  size_t totalSize = offset;
  for (uint i = 0; i < segmentCount; i++) {
    totalSize += table[i + 1].get();
  }
  return totalSize;
}